

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::LayerParameter::MergeFrom(LayerParameter *this,LayerParameter *from)

{
  byte *pbVar1;
  uint32 *puVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  string *psVar6;
  string *psVar7;
  LogMessage *pLVar8;
  TransformationParameter *pTVar9;
  LossParameter *pLVar10;
  AccuracyParameter *pAVar11;
  ArgMaxParameter *pAVar12;
  ConcatParameter *pCVar13;
  ContrastiveLossParameter *pCVar14;
  ConvolutionParameter *pCVar15;
  DataParameter *pDVar16;
  DropoutParameter *pDVar17;
  DummyDataParameter *pDVar18;
  EltwiseParameter *pEVar19;
  ExpParameter *pEVar20;
  HDF5DataParameter *pHVar21;
  HDF5OutputParameter *pHVar22;
  HingeLossParameter *pHVar23;
  ImageDataParameter *pIVar24;
  InfogainLossParameter *pIVar25;
  InnerProductParameter *pIVar26;
  LRNParameter *pLVar27;
  MemoryDataParameter *pMVar28;
  MVNParameter *pMVar29;
  PoolingParameter *pPVar30;
  PowerParameter *pPVar31;
  ReLUParameter *pRVar32;
  SigmoidParameter *pSVar33;
  SoftmaxParameter *pSVar34;
  SliceParameter *pSVar35;
  TanHParameter *pTVar36;
  ThresholdParameter *pTVar37;
  WindowDataParameter *pWVar38;
  PythonParameter *pPVar39;
  PReLUParameter *pPVar40;
  SPPParameter *pSVar41;
  ReshapeParameter *pRVar42;
  LogParameter *pLVar43;
  FlattenParameter *pFVar44;
  ReductionParameter *pRVar45;
  EmbedParameter *pEVar46;
  TileParameter *pTVar47;
  BatchNormParameter *pBVar48;
  ELUParameter *pEVar49;
  BiasParameter *pBVar50;
  ScaleParameter *pSVar51;
  InputParameter *pIVar52;
  CropParameter *pCVar53;
  ParameterParameter *pPVar54;
  RecurrentParameter *pRVar55;
  LogFinisher local_c9;
  LogMessage local_c8;
  LogMessage local_90;
  LogMessage local_58;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
               ,0x3ad1);
    pLVar8 = google::protobuf::internal::LogMessage::operator<<
                       (&local_90,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_c8,pLVar8);
    google::protobuf::internal::LogMessage::~LogMessage(&local_90);
  }
  pvVar5 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar5 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe));
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->bottom_).super_RepeatedPtrFieldBase,&(from->bottom_).super_RepeatedPtrFieldBase
            );
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->top_).super_RepeatedPtrFieldBase,&(from->top_).super_RepeatedPtrFieldBase);
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar8 = google::protobuf::internal::LogMessage::operator<<
                       (&local_58,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_c8,pLVar8);
    google::protobuf::internal::LogMessage::~LogMessage(&local_58);
  }
  iVar3 = (from->loss_weight_).current_size_;
  if (iVar3 != 0) {
    google::protobuf::RepeatedField<float>::Reserve
              (&this->loss_weight_,iVar3 + (this->loss_weight_).current_size_);
    memcpy(((this->loss_weight_).rep_)->elements + (this->loss_weight_).current_size_,
           ((from->loss_weight_).rep_)->elements,(long)(from->loss_weight_).current_size_ << 2);
    (this->loss_weight_).current_size_ =
         (this->loss_weight_).current_size_ + (from->loss_weight_).current_size_;
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::ParamSpec>::TypeHandler>
            (&(this->param_).super_RepeatedPtrFieldBase,&(from->param_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
            (&(this->blobs_).super_RepeatedPtrFieldBase,&(from->blobs_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
            (&(this->include_).super_RepeatedPtrFieldBase,
             &(from->include_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
            (&(this->exclude_).super_RepeatedPtrFieldBase,
             &(from->exclude_).super_RepeatedPtrFieldBase);
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_c8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar8 = google::protobuf::internal::LogMessage::operator<<
                       (&local_c8,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_c9,pLVar8);
    google::protobuf::internal::LogMessage::~LogMessage(&local_c8);
  }
  iVar3 = (from->propagate_down_).current_size_;
  if (iVar3 != 0) {
    google::protobuf::RepeatedField<bool>::Reserve
              (&this->propagate_down_,iVar3 + (this->propagate_down_).current_size_);
    memcpy(((this->propagate_down_).rep_)->elements + (this->propagate_down_).current_size_,
           ((from->propagate_down_).rep_)->elements,(long)(from->propagate_down_).current_size_);
    (this->propagate_down_).current_size_ =
         (this->propagate_down_).current_size_ + (from->propagate_down_).current_size_;
  }
  uVar4 = (from->_has_bits_).has_bits_[0];
  if ((char)uVar4 != '\0') {
    if ((uVar4 & 1) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      psVar6 = (from->name_).ptr_;
      psVar7 = (this->name_).ptr_;
      if (psVar7 != psVar6) {
        if (psVar7 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->name_,psVar6);
        }
        else {
          std::__cxx11::string::_M_assign((string *)psVar7);
        }
      }
    }
    if ((uVar4 & 2) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      psVar6 = (from->type_).ptr_;
      psVar7 = (this->type_).ptr_;
      if (psVar7 != psVar6) {
        if (psVar7 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->type_,psVar6);
        }
        else {
          std::__cxx11::string::_M_assign((string *)psVar7);
        }
      }
    }
    if ((uVar4 & 4) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      if (this->transform_param_ == (TransformationParameter *)0x0) {
        pTVar9 = (TransformationParameter *)operator_new(0x40);
        TransformationParameter::TransformationParameter(pTVar9);
        this->transform_param_ = pTVar9;
      }
      pTVar9 = from->transform_param_;
      if (pTVar9 == (TransformationParameter *)0x0) {
        pTVar9 = (TransformationParameter *)&_TransformationParameter_default_instance_;
      }
      TransformationParameter::MergeFrom(this->transform_param_,pTVar9);
    }
    if ((uVar4 & 8) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      if (this->loss_param_ == (LossParameter *)0x0) {
        pLVar10 = (LossParameter *)operator_new(0x28);
        LossParameter::LossParameter(pLVar10);
        this->loss_param_ = pLVar10;
      }
      pLVar10 = from->loss_param_;
      if (pLVar10 == (LossParameter *)0x0) {
        pLVar10 = (LossParameter *)&_LossParameter_default_instance_;
      }
      LossParameter::MergeFrom(this->loss_param_,pLVar10);
    }
    if ((uVar4 & 0x10) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
      if (this->accuracy_param_ == (AccuracyParameter *)0x0) {
        pAVar11 = (AccuracyParameter *)operator_new(0x28);
        AccuracyParameter::AccuracyParameter(pAVar11);
        this->accuracy_param_ = pAVar11;
      }
      pAVar11 = from->accuracy_param_;
      if (pAVar11 == (AccuracyParameter *)0x0) {
        pAVar11 = (AccuracyParameter *)&_AccuracyParameter_default_instance_;
      }
      AccuracyParameter::MergeFrom(this->accuracy_param_,pAVar11);
    }
    if ((uVar4 & 0x20) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
      if (this->argmax_param_ == (ArgMaxParameter *)0x0) {
        pAVar12 = (ArgMaxParameter *)operator_new(0x28);
        ArgMaxParameter::ArgMaxParameter(pAVar12);
        this->argmax_param_ = pAVar12;
      }
      pAVar12 = from->argmax_param_;
      if (pAVar12 == (ArgMaxParameter *)0x0) {
        pAVar12 = (ArgMaxParameter *)&_ArgMaxParameter_default_instance_;
      }
      ArgMaxParameter::MergeFrom(this->argmax_param_,pAVar12);
    }
    if ((uVar4 & 0x40) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x40;
      if (this->concat_param_ == (ConcatParameter *)0x0) {
        pCVar13 = (ConcatParameter *)operator_new(0x20);
        ConcatParameter::ConcatParameter(pCVar13);
        this->concat_param_ = pCVar13;
      }
      pCVar13 = from->concat_param_;
      if (pCVar13 == (ConcatParameter *)0x0) {
        pCVar13 = (ConcatParameter *)&_ConcatParameter_default_instance_;
      }
      ConcatParameter::MergeFrom(this->concat_param_,pCVar13);
    }
    if ((char)uVar4 < '\0') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x80;
      if (this->contrastive_loss_param_ == (ContrastiveLossParameter *)0x0) {
        pCVar14 = (ContrastiveLossParameter *)operator_new(0x20);
        ContrastiveLossParameter::ContrastiveLossParameter(pCVar14);
        this->contrastive_loss_param_ = pCVar14;
      }
      pCVar14 = from->contrastive_loss_param_;
      if (pCVar14 == (ContrastiveLossParameter *)0x0) {
        pCVar14 = (ContrastiveLossParameter *)&_ContrastiveLossParameter_default_instance_;
      }
      ContrastiveLossParameter::MergeFrom(this->contrastive_loss_param_,pCVar14);
    }
  }
  if ((uVar4 & 0xff00) != 0) {
    if ((uVar4 >> 8 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 | 1;
      if (this->convolution_param_ == (ConvolutionParameter *)0x0) {
        pCVar15 = (ConvolutionParameter *)operator_new(0x98);
        ConvolutionParameter::ConvolutionParameter(pCVar15);
        this->convolution_param_ = pCVar15;
      }
      pCVar15 = from->convolution_param_;
      if (pCVar15 == (ConvolutionParameter *)0x0) {
        pCVar15 = (ConvolutionParameter *)&_ConvolutionParameter_default_instance_;
      }
      ConvolutionParameter::MergeFrom(this->convolution_param_,pCVar15);
    }
    if ((uVar4 >> 9 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 | 2;
      if (this->data_param_ == (DataParameter *)0x0) {
        pDVar16 = (DataParameter *)operator_new(0x48);
        DataParameter::DataParameter(pDVar16);
        this->data_param_ = pDVar16;
      }
      pDVar16 = from->data_param_;
      if (pDVar16 == (DataParameter *)0x0) {
        pDVar16 = (DataParameter *)&_DataParameter_default_instance_;
      }
      DataParameter::MergeFrom(this->data_param_,pDVar16);
    }
    if ((uVar4 >> 10 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 | 4;
      if (this->dropout_param_ == (DropoutParameter *)0x0) {
        pDVar17 = (DropoutParameter *)operator_new(0x20);
        DropoutParameter::DropoutParameter(pDVar17);
        this->dropout_param_ = pDVar17;
      }
      pDVar17 = from->dropout_param_;
      if (pDVar17 == (DropoutParameter *)0x0) {
        pDVar17 = (DropoutParameter *)&_DropoutParameter_default_instance_;
      }
      DropoutParameter::MergeFrom(this->dropout_param_,pDVar17);
    }
    if ((uVar4 >> 0xb & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 | 8;
      if (this->dummy_data_param_ == (DummyDataParameter *)0x0) {
        pDVar18 = (DummyDataParameter *)operator_new(0x88);
        DummyDataParameter::DummyDataParameter(pDVar18);
        this->dummy_data_param_ = pDVar18;
      }
      pDVar18 = from->dummy_data_param_;
      if (pDVar18 == (DummyDataParameter *)0x0) {
        pDVar18 = (DummyDataParameter *)&_DummyDataParameter_default_instance_;
      }
      DummyDataParameter::MergeFrom(this->dummy_data_param_,pDVar18);
    }
    if ((uVar4 >> 0xc & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 | 0x10;
      if (this->eltwise_param_ == (EltwiseParameter *)0x0) {
        pEVar19 = (EltwiseParameter *)operator_new(0x30);
        EltwiseParameter::EltwiseParameter(pEVar19);
        this->eltwise_param_ = pEVar19;
      }
      pEVar19 = from->eltwise_param_;
      if (pEVar19 == (EltwiseParameter *)0x0) {
        pEVar19 = (EltwiseParameter *)&_EltwiseParameter_default_instance_;
      }
      EltwiseParameter::MergeFrom(this->eltwise_param_,pEVar19);
    }
    if ((uVar4 >> 0xd & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 | 0x20;
      if (this->exp_param_ == (ExpParameter *)0x0) {
        pEVar20 = (ExpParameter *)operator_new(0x28);
        ExpParameter::ExpParameter(pEVar20);
        this->exp_param_ = pEVar20;
      }
      pEVar20 = from->exp_param_;
      if (pEVar20 == (ExpParameter *)0x0) {
        pEVar20 = (ExpParameter *)&_ExpParameter_default_instance_;
      }
      ExpParameter::MergeFrom(this->exp_param_,pEVar20);
    }
    if ((uVar4 >> 0xe & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 | 0x40;
      if (this->hdf5_data_param_ == (HDF5DataParameter *)0x0) {
        pHVar21 = (HDF5DataParameter *)operator_new(0x28);
        HDF5DataParameter::HDF5DataParameter(pHVar21);
        this->hdf5_data_param_ = pHVar21;
      }
      pHVar21 = from->hdf5_data_param_;
      if (pHVar21 == (HDF5DataParameter *)0x0) {
        pHVar21 = (HDF5DataParameter *)&_HDF5DataParameter_default_instance_;
      }
      HDF5DataParameter::MergeFrom(this->hdf5_data_param_,pHVar21);
    }
    if ((short)uVar4 < 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar1 = *pbVar1 | 0x80;
      if (this->hdf5_output_param_ == (HDF5OutputParameter *)0x0) {
        pHVar22 = (HDF5OutputParameter *)operator_new(0x20);
        HDF5OutputParameter::HDF5OutputParameter(pHVar22);
        this->hdf5_output_param_ = pHVar22;
      }
      pHVar22 = from->hdf5_output_param_;
      if (pHVar22 == (HDF5OutputParameter *)0x0) {
        pHVar22 = (HDF5OutputParameter *)&_HDF5OutputParameter_default_instance_;
      }
      HDF5OutputParameter::MergeFrom(this->hdf5_output_param_,pHVar22);
    }
  }
  if ((uVar4 & 0xff0000) != 0) {
    if ((uVar4 >> 0x10 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar1 = *pbVar1 | 1;
      if (this->hinge_loss_param_ == (HingeLossParameter *)0x0) {
        pHVar23 = (HingeLossParameter *)operator_new(0x20);
        HingeLossParameter::HingeLossParameter(pHVar23);
        this->hinge_loss_param_ = pHVar23;
      }
      pHVar23 = from->hinge_loss_param_;
      if (pHVar23 == (HingeLossParameter *)0x0) {
        pHVar23 = (HingeLossParameter *)&_HingeLossParameter_default_instance_;
      }
      HingeLossParameter::MergeFrom(this->hinge_loss_param_,pHVar23);
    }
    if ((uVar4 >> 0x11 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar1 = *pbVar1 | 2;
      if (this->image_data_param_ == (ImageDataParameter *)0x0) {
        pIVar24 = (ImageDataParameter *)operator_new(0x50);
        ImageDataParameter::ImageDataParameter(pIVar24);
        this->image_data_param_ = pIVar24;
      }
      pIVar24 = from->image_data_param_;
      if (pIVar24 == (ImageDataParameter *)0x0) {
        pIVar24 = (ImageDataParameter *)&_ImageDataParameter_default_instance_;
      }
      ImageDataParameter::MergeFrom(this->image_data_param_,pIVar24);
    }
    if ((uVar4 >> 0x12 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar1 = *pbVar1 | 4;
      if (this->infogain_loss_param_ == (InfogainLossParameter *)0x0) {
        pIVar25 = (InfogainLossParameter *)operator_new(0x20);
        InfogainLossParameter::InfogainLossParameter(pIVar25);
        this->infogain_loss_param_ = pIVar25;
      }
      pIVar25 = from->infogain_loss_param_;
      if (pIVar25 == (InfogainLossParameter *)0x0) {
        pIVar25 = (InfogainLossParameter *)&_InfogainLossParameter_default_instance_;
      }
      InfogainLossParameter::MergeFrom(this->infogain_loss_param_,pIVar25);
    }
    if ((uVar4 >> 0x13 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar1 = *pbVar1 | 8;
      if (this->inner_product_param_ == (InnerProductParameter *)0x0) {
        pIVar26 = (InnerProductParameter *)operator_new(0x38);
        InnerProductParameter::InnerProductParameter(pIVar26);
        this->inner_product_param_ = pIVar26;
      }
      pIVar26 = from->inner_product_param_;
      if (pIVar26 == (InnerProductParameter *)0x0) {
        pIVar26 = (InnerProductParameter *)&_InnerProductParameter_default_instance_;
      }
      InnerProductParameter::MergeFrom(this->inner_product_param_,pIVar26);
    }
    if ((uVar4 >> 0x14 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar1 = *pbVar1 | 0x10;
      if (this->lrn_param_ == (LRNParameter *)0x0) {
        pLVar27 = (LRNParameter *)operator_new(0x30);
        LRNParameter::LRNParameter(pLVar27);
        this->lrn_param_ = pLVar27;
      }
      pLVar27 = from->lrn_param_;
      if (pLVar27 == (LRNParameter *)0x0) {
        pLVar27 = (LRNParameter *)&_LRNParameter_default_instance_;
      }
      LRNParameter::MergeFrom(this->lrn_param_,pLVar27);
    }
    if ((uVar4 >> 0x15 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar1 = *pbVar1 | 0x20;
      if (this->memory_data_param_ == (MemoryDataParameter *)0x0) {
        pMVar28 = (MemoryDataParameter *)operator_new(0x28);
        MemoryDataParameter::MemoryDataParameter(pMVar28);
        this->memory_data_param_ = pMVar28;
      }
      pMVar28 = from->memory_data_param_;
      if (pMVar28 == (MemoryDataParameter *)0x0) {
        pMVar28 = (MemoryDataParameter *)&_MemoryDataParameter_default_instance_;
      }
      MemoryDataParameter::MergeFrom(this->memory_data_param_,pMVar28);
    }
    if ((uVar4 >> 0x16 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar1 = *pbVar1 | 0x40;
      if (this->mvn_param_ == (MVNParameter *)0x0) {
        pMVar29 = (MVNParameter *)operator_new(0x20);
        MVNParameter::MVNParameter(pMVar29);
        this->mvn_param_ = pMVar29;
      }
      pMVar29 = from->mvn_param_;
      if (pMVar29 == (MVNParameter *)0x0) {
        pMVar29 = (MVNParameter *)&_MVNParameter_default_instance_;
      }
      MVNParameter::MergeFrom(this->mvn_param_,pMVar29);
    }
    if ((uVar4 >> 0x17 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 2);
      *pbVar1 = *pbVar1 | 0x80;
      if (this->pooling_param_ == (PoolingParameter *)0x0) {
        pPVar30 = (PoolingParameter *)operator_new(0x48);
        PoolingParameter::PoolingParameter(pPVar30);
        this->pooling_param_ = pPVar30;
      }
      pPVar30 = from->pooling_param_;
      if (pPVar30 == (PoolingParameter *)0x0) {
        pPVar30 = (PoolingParameter *)&_PoolingParameter_default_instance_;
      }
      PoolingParameter::MergeFrom(this->pooling_param_,pPVar30);
    }
  }
  if (0xffffff < uVar4) {
    if ((uVar4 >> 0x18 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar1 = *pbVar1 | 1;
      if (this->power_param_ == (PowerParameter *)0x0) {
        pPVar31 = (PowerParameter *)operator_new(0x28);
        PowerParameter::PowerParameter(pPVar31);
        this->power_param_ = pPVar31;
      }
      pPVar31 = from->power_param_;
      if (pPVar31 == (PowerParameter *)0x0) {
        pPVar31 = (PowerParameter *)&_PowerParameter_default_instance_;
      }
      PowerParameter::MergeFrom(this->power_param_,pPVar31);
    }
    if ((uVar4 >> 0x19 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar1 = *pbVar1 | 2;
      if (this->relu_param_ == (ReLUParameter *)0x0) {
        pRVar32 = (ReLUParameter *)operator_new(0x20);
        ReLUParameter::ReLUParameter(pRVar32);
        this->relu_param_ = pRVar32;
      }
      pRVar32 = from->relu_param_;
      if (pRVar32 == (ReLUParameter *)0x0) {
        pRVar32 = (ReLUParameter *)&_ReLUParameter_default_instance_;
      }
      ReLUParameter::MergeFrom(this->relu_param_,pRVar32);
    }
    if ((uVar4 >> 0x1a & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar1 = *pbVar1 | 4;
      if (this->sigmoid_param_ == (SigmoidParameter *)0x0) {
        pSVar33 = (SigmoidParameter *)operator_new(0x20);
        SigmoidParameter::SigmoidParameter(pSVar33);
        this->sigmoid_param_ = pSVar33;
      }
      pSVar33 = from->sigmoid_param_;
      if (pSVar33 == (SigmoidParameter *)0x0) {
        pSVar33 = (SigmoidParameter *)&_SigmoidParameter_default_instance_;
      }
      SigmoidParameter::MergeFrom(this->sigmoid_param_,pSVar33);
    }
    if ((uVar4 >> 0x1b & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar1 = *pbVar1 | 8;
      if (this->softmax_param_ == (SoftmaxParameter *)0x0) {
        pSVar34 = (SoftmaxParameter *)operator_new(0x20);
        SoftmaxParameter::SoftmaxParameter(pSVar34);
        this->softmax_param_ = pSVar34;
      }
      pSVar34 = from->softmax_param_;
      if (pSVar34 == (SoftmaxParameter *)0x0) {
        pSVar34 = (SoftmaxParameter *)&_SoftmaxParameter_default_instance_;
      }
      SoftmaxParameter::MergeFrom(this->softmax_param_,pSVar34);
    }
    if ((uVar4 >> 0x1c & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar1 = *pbVar1 | 0x10;
      if (this->slice_param_ == (SliceParameter *)0x0) {
        pSVar35 = (SliceParameter *)operator_new(0x30);
        SliceParameter::SliceParameter(pSVar35);
        this->slice_param_ = pSVar35;
      }
      pSVar35 = from->slice_param_;
      if (pSVar35 == (SliceParameter *)0x0) {
        pSVar35 = (SliceParameter *)&_SliceParameter_default_instance_;
      }
      SliceParameter::MergeFrom(this->slice_param_,pSVar35);
    }
    if ((uVar4 >> 0x1d & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar1 = *pbVar1 | 0x20;
      if (this->tanh_param_ == (TanHParameter *)0x0) {
        pTVar36 = (TanHParameter *)operator_new(0x20);
        TanHParameter::TanHParameter(pTVar36);
        this->tanh_param_ = pTVar36;
      }
      pTVar36 = from->tanh_param_;
      if (pTVar36 == (TanHParameter *)0x0) {
        pTVar36 = (TanHParameter *)&_TanHParameter_default_instance_;
      }
      TanHParameter::MergeFrom(this->tanh_param_,pTVar36);
    }
    if ((uVar4 >> 0x1e & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar1 = *pbVar1 | 0x40;
      if (this->threshold_param_ == (ThresholdParameter *)0x0) {
        pTVar37 = (ThresholdParameter *)operator_new(0x20);
        ThresholdParameter::ThresholdParameter(pTVar37);
        this->threshold_param_ = pTVar37;
      }
      pTVar37 = from->threshold_param_;
      if (pTVar37 == (ThresholdParameter *)0x0) {
        pTVar37 = (ThresholdParameter *)&_ThresholdParameter_default_instance_;
      }
      ThresholdParameter::MergeFrom(this->threshold_param_,pTVar37);
    }
    if ((int)uVar4 < 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 3);
      *pbVar1 = *pbVar1 | 0x80;
      if (this->window_data_param_ == (WindowDataParameter *)0x0) {
        pWVar38 = (WindowDataParameter *)operator_new(0x58);
        WindowDataParameter::WindowDataParameter(pWVar38);
        this->window_data_param_ = pWVar38;
      }
      pWVar38 = from->window_data_param_;
      if (pWVar38 == (WindowDataParameter *)0x0) {
        pWVar38 = (WindowDataParameter *)&_WindowDataParameter_default_instance_;
      }
      WindowDataParameter::MergeFrom(this->window_data_param_,pWVar38);
    }
  }
  uVar4 = (from->_has_bits_).has_bits_[1];
  if ((char)uVar4 != '\0') {
    if ((uVar4 & 1) != 0) {
      puVar2 = (this->_has_bits_).has_bits_ + 1;
      *(byte *)puVar2 = (byte)*puVar2 | 1;
      if (this->python_param_ == (PythonParameter *)0x0) {
        pPVar39 = (PythonParameter *)operator_new(0x38);
        PythonParameter::PythonParameter(pPVar39);
        this->python_param_ = pPVar39;
      }
      pPVar39 = from->python_param_;
      if (pPVar39 == (PythonParameter *)0x0) {
        pPVar39 = (PythonParameter *)&_PythonParameter_default_instance_;
      }
      PythonParameter::MergeFrom(this->python_param_,pPVar39);
    }
    if ((uVar4 & 2) != 0) {
      puVar2 = (this->_has_bits_).has_bits_ + 1;
      *(byte *)puVar2 = (byte)*puVar2 | 2;
      if (this->prelu_param_ == (PReLUParameter *)0x0) {
        pPVar40 = (PReLUParameter *)operator_new(0x28);
        PReLUParameter::PReLUParameter(pPVar40);
        this->prelu_param_ = pPVar40;
      }
      pPVar40 = from->prelu_param_;
      if (pPVar40 == (PReLUParameter *)0x0) {
        pPVar40 = (PReLUParameter *)&_PReLUParameter_default_instance_;
      }
      PReLUParameter::MergeFrom(this->prelu_param_,pPVar40);
    }
    if ((uVar4 & 4) != 0) {
      puVar2 = (this->_has_bits_).has_bits_ + 1;
      *(byte *)puVar2 = (byte)*puVar2 | 4;
      if (this->spp_param_ == (SPPParameter *)0x0) {
        pSVar41 = (SPPParameter *)operator_new(0x28);
        SPPParameter::SPPParameter(pSVar41);
        this->spp_param_ = pSVar41;
      }
      pSVar41 = from->spp_param_;
      if (pSVar41 == (SPPParameter *)0x0) {
        pSVar41 = (SPPParameter *)&_SPPParameter_default_instance_;
      }
      SPPParameter::MergeFrom(this->spp_param_,pSVar41);
    }
    if ((uVar4 & 8) != 0) {
      puVar2 = (this->_has_bits_).has_bits_ + 1;
      *(byte *)puVar2 = (byte)*puVar2 | 8;
      if (this->reshape_param_ == (ReshapeParameter *)0x0) {
        pRVar42 = (ReshapeParameter *)operator_new(0x28);
        ReshapeParameter::ReshapeParameter(pRVar42);
        this->reshape_param_ = pRVar42;
      }
      pRVar42 = from->reshape_param_;
      if (pRVar42 == (ReshapeParameter *)0x0) {
        pRVar42 = (ReshapeParameter *)&_ReshapeParameter_default_instance_;
      }
      ReshapeParameter::MergeFrom(this->reshape_param_,pRVar42);
    }
    if ((uVar4 & 0x10) != 0) {
      puVar2 = (this->_has_bits_).has_bits_ + 1;
      *(byte *)puVar2 = (byte)*puVar2 | 0x10;
      if (this->log_param_ == (LogParameter *)0x0) {
        pLVar43 = (LogParameter *)operator_new(0x28);
        LogParameter::LogParameter(pLVar43);
        this->log_param_ = pLVar43;
      }
      pLVar43 = from->log_param_;
      if (pLVar43 == (LogParameter *)0x0) {
        pLVar43 = (LogParameter *)&_LogParameter_default_instance_;
      }
      LogParameter::MergeFrom(this->log_param_,pLVar43);
    }
    if ((uVar4 & 0x20) != 0) {
      puVar2 = (this->_has_bits_).has_bits_ + 1;
      *(byte *)puVar2 = (byte)*puVar2 | 0x20;
      if (this->flatten_param_ == (FlattenParameter *)0x0) {
        pFVar44 = (FlattenParameter *)operator_new(0x20);
        FlattenParameter::FlattenParameter(pFVar44);
        this->flatten_param_ = pFVar44;
      }
      pFVar44 = from->flatten_param_;
      if (pFVar44 == (FlattenParameter *)0x0) {
        pFVar44 = (FlattenParameter *)&_FlattenParameter_default_instance_;
      }
      FlattenParameter::MergeFrom(this->flatten_param_,pFVar44);
    }
    if ((uVar4 & 0x40) != 0) {
      puVar2 = (this->_has_bits_).has_bits_ + 1;
      *(byte *)puVar2 = (byte)*puVar2 | 0x40;
      if (this->reduction_param_ == (ReductionParameter *)0x0) {
        pRVar45 = (ReductionParameter *)operator_new(0x28);
        ReductionParameter::ReductionParameter(pRVar45);
        this->reduction_param_ = pRVar45;
      }
      pRVar45 = from->reduction_param_;
      if (pRVar45 == (ReductionParameter *)0x0) {
        pRVar45 = (ReductionParameter *)&_ReductionParameter_default_instance_;
      }
      ReductionParameter::MergeFrom(this->reduction_param_,pRVar45);
    }
    if ((char)uVar4 < '\0') {
      puVar2 = (this->_has_bits_).has_bits_ + 1;
      *(byte *)puVar2 = (byte)*puVar2 | 0x80;
      if (this->embed_param_ == (EmbedParameter *)0x0) {
        pEVar46 = (EmbedParameter *)operator_new(0x38);
        EmbedParameter::EmbedParameter(pEVar46);
        this->embed_param_ = pEVar46;
      }
      pEVar46 = from->embed_param_;
      if (pEVar46 == (EmbedParameter *)0x0) {
        pEVar46 = (EmbedParameter *)&_EmbedParameter_default_instance_;
      }
      EmbedParameter::MergeFrom(this->embed_param_,pEVar46);
    }
  }
  if ((uVar4 & 0xff00) != 0) {
    if ((uVar4 >> 8 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 5);
      *pbVar1 = *pbVar1 | 1;
      if (this->tile_param_ == (TileParameter *)0x0) {
        pTVar47 = (TileParameter *)operator_new(0x20);
        TileParameter::TileParameter(pTVar47);
        this->tile_param_ = pTVar47;
      }
      pTVar47 = from->tile_param_;
      if (pTVar47 == (TileParameter *)0x0) {
        pTVar47 = (TileParameter *)&_TileParameter_default_instance_;
      }
      TileParameter::MergeFrom(this->tile_param_,pTVar47);
    }
    if ((uVar4 >> 9 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 5);
      *pbVar1 = *pbVar1 | 2;
      if (this->batch_norm_param_ == (BatchNormParameter *)0x0) {
        pBVar48 = (BatchNormParameter *)operator_new(0x28);
        BatchNormParameter::BatchNormParameter(pBVar48);
        this->batch_norm_param_ = pBVar48;
      }
      pBVar48 = from->batch_norm_param_;
      if (pBVar48 == (BatchNormParameter *)0x0) {
        pBVar48 = (BatchNormParameter *)&_BatchNormParameter_default_instance_;
      }
      BatchNormParameter::MergeFrom(this->batch_norm_param_,pBVar48);
    }
    if ((uVar4 >> 10 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 5);
      *pbVar1 = *pbVar1 | 4;
      if (this->elu_param_ == (ELUParameter *)0x0) {
        pEVar49 = (ELUParameter *)operator_new(0x20);
        ELUParameter::ELUParameter(pEVar49);
        this->elu_param_ = pEVar49;
      }
      pEVar49 = from->elu_param_;
      if (pEVar49 == (ELUParameter *)0x0) {
        pEVar49 = (ELUParameter *)&_ELUParameter_default_instance_;
      }
      ELUParameter::MergeFrom(this->elu_param_,pEVar49);
    }
    if ((uVar4 >> 0xb & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 5);
      *pbVar1 = *pbVar1 | 8;
      if (this->bias_param_ == (BiasParameter *)0x0) {
        pBVar50 = (BiasParameter *)operator_new(0x28);
        BiasParameter::BiasParameter(pBVar50);
        this->bias_param_ = pBVar50;
      }
      pBVar50 = from->bias_param_;
      if (pBVar50 == (BiasParameter *)0x0) {
        pBVar50 = (BiasParameter *)&_BiasParameter_default_instance_;
      }
      BiasParameter::MergeFrom(this->bias_param_,pBVar50);
    }
    if ((uVar4 >> 0xc & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 5);
      *pbVar1 = *pbVar1 | 0x10;
      if (this->scale_param_ == (ScaleParameter *)0x0) {
        pSVar51 = (ScaleParameter *)operator_new(0x38);
        ScaleParameter::ScaleParameter(pSVar51);
        this->scale_param_ = pSVar51;
      }
      pSVar51 = from->scale_param_;
      if (pSVar51 == (ScaleParameter *)0x0) {
        pSVar51 = (ScaleParameter *)&_ScaleParameter_default_instance_;
      }
      ScaleParameter::MergeFrom(this->scale_param_,pSVar51);
    }
    if ((uVar4 >> 0xd & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 5);
      *pbVar1 = *pbVar1 | 0x20;
      if (this->input_param_ == (InputParameter *)0x0) {
        pIVar52 = (InputParameter *)operator_new(0x30);
        InputParameter::InputParameter(pIVar52);
        this->input_param_ = pIVar52;
      }
      pIVar52 = from->input_param_;
      if (pIVar52 == (InputParameter *)0x0) {
        pIVar52 = (InputParameter *)&_InputParameter_default_instance_;
      }
      InputParameter::MergeFrom(this->input_param_,pIVar52);
    }
    if ((uVar4 >> 0xe & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 5);
      *pbVar1 = *pbVar1 | 0x40;
      if (this->crop_param_ == (CropParameter *)0x0) {
        pCVar53 = (CropParameter *)operator_new(0x30);
        CropParameter::CropParameter(pCVar53);
        this->crop_param_ = pCVar53;
      }
      pCVar53 = from->crop_param_;
      if (pCVar53 == (CropParameter *)0x0) {
        pCVar53 = (CropParameter *)&_CropParameter_default_instance_;
      }
      CropParameter::MergeFrom(this->crop_param_,pCVar53);
    }
    if ((short)uVar4 < 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 5);
      *pbVar1 = *pbVar1 | 0x80;
      if (this->parameter_param_ == (ParameterParameter *)0x0) {
        pPVar54 = (ParameterParameter *)operator_new(0x20);
        ParameterParameter::ParameterParameter(pPVar54);
        this->parameter_param_ = pPVar54;
      }
      pPVar54 = from->parameter_param_;
      if (pPVar54 == (ParameterParameter *)0x0) {
        pPVar54 = (ParameterParameter *)&_ParameterParameter_default_instance_;
      }
      ParameterParameter::MergeFrom(this->parameter_param_,pPVar54);
    }
  }
  if ((uVar4 & 0x30000) != 0) {
    if ((uVar4 >> 0x10 & 1) != 0) {
      pbVar1 = (byte *)((long)(this->_has_bits_).has_bits_ + 6);
      *pbVar1 = *pbVar1 | 1;
      if (this->recurrent_param_ == (RecurrentParameter *)0x0) {
        pRVar55 = (RecurrentParameter *)operator_new(0x30);
        RecurrentParameter::RecurrentParameter(pRVar55);
        this->recurrent_param_ = pRVar55;
      }
      pRVar55 = from->recurrent_param_;
      if (pRVar55 == (RecurrentParameter *)0x0) {
        pRVar55 = (RecurrentParameter *)&_RecurrentParameter_default_instance_;
      }
      RecurrentParameter::MergeFrom(this->recurrent_param_,pRVar55);
    }
    if ((uVar4 >> 0x11 & 1) != 0) {
      this->phase_ = from->phase_;
    }
    puVar2 = (this->_has_bits_).has_bits_ + 1;
    *puVar2 = *puVar2 | uVar4;
  }
  return;
}

Assistant:

void LayerParameter::MergeFrom(const LayerParameter& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:caffe.LayerParameter)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  bottom_.MergeFrom(from.bottom_);
  top_.MergeFrom(from.top_);
  loss_weight_.MergeFrom(from.loss_weight_);
  param_.MergeFrom(from.param_);
  blobs_.MergeFrom(from.blobs_);
  include_.MergeFrom(from.include_);
  exclude_.MergeFrom(from.exclude_);
  propagate_down_.MergeFrom(from.propagate_down_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 255u) {
    if (cached_has_bits & 0x00000001u) {
      set_has_name();
      name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
    }
    if (cached_has_bits & 0x00000002u) {
      set_has_type();
      type_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.type_);
    }
    if (cached_has_bits & 0x00000004u) {
      mutable_transform_param()->::caffe::TransformationParameter::MergeFrom(from.transform_param());
    }
    if (cached_has_bits & 0x00000008u) {
      mutable_loss_param()->::caffe::LossParameter::MergeFrom(from.loss_param());
    }
    if (cached_has_bits & 0x00000010u) {
      mutable_accuracy_param()->::caffe::AccuracyParameter::MergeFrom(from.accuracy_param());
    }
    if (cached_has_bits & 0x00000020u) {
      mutable_argmax_param()->::caffe::ArgMaxParameter::MergeFrom(from.argmax_param());
    }
    if (cached_has_bits & 0x00000040u) {
      mutable_concat_param()->::caffe::ConcatParameter::MergeFrom(from.concat_param());
    }
    if (cached_has_bits & 0x00000080u) {
      mutable_contrastive_loss_param()->::caffe::ContrastiveLossParameter::MergeFrom(from.contrastive_loss_param());
    }
  }
  if (cached_has_bits & 65280u) {
    if (cached_has_bits & 0x00000100u) {
      mutable_convolution_param()->::caffe::ConvolutionParameter::MergeFrom(from.convolution_param());
    }
    if (cached_has_bits & 0x00000200u) {
      mutable_data_param()->::caffe::DataParameter::MergeFrom(from.data_param());
    }
    if (cached_has_bits & 0x00000400u) {
      mutable_dropout_param()->::caffe::DropoutParameter::MergeFrom(from.dropout_param());
    }
    if (cached_has_bits & 0x00000800u) {
      mutable_dummy_data_param()->::caffe::DummyDataParameter::MergeFrom(from.dummy_data_param());
    }
    if (cached_has_bits & 0x00001000u) {
      mutable_eltwise_param()->::caffe::EltwiseParameter::MergeFrom(from.eltwise_param());
    }
    if (cached_has_bits & 0x00002000u) {
      mutable_exp_param()->::caffe::ExpParameter::MergeFrom(from.exp_param());
    }
    if (cached_has_bits & 0x00004000u) {
      mutable_hdf5_data_param()->::caffe::HDF5DataParameter::MergeFrom(from.hdf5_data_param());
    }
    if (cached_has_bits & 0x00008000u) {
      mutable_hdf5_output_param()->::caffe::HDF5OutputParameter::MergeFrom(from.hdf5_output_param());
    }
  }
  if (cached_has_bits & 16711680u) {
    if (cached_has_bits & 0x00010000u) {
      mutable_hinge_loss_param()->::caffe::HingeLossParameter::MergeFrom(from.hinge_loss_param());
    }
    if (cached_has_bits & 0x00020000u) {
      mutable_image_data_param()->::caffe::ImageDataParameter::MergeFrom(from.image_data_param());
    }
    if (cached_has_bits & 0x00040000u) {
      mutable_infogain_loss_param()->::caffe::InfogainLossParameter::MergeFrom(from.infogain_loss_param());
    }
    if (cached_has_bits & 0x00080000u) {
      mutable_inner_product_param()->::caffe::InnerProductParameter::MergeFrom(from.inner_product_param());
    }
    if (cached_has_bits & 0x00100000u) {
      mutable_lrn_param()->::caffe::LRNParameter::MergeFrom(from.lrn_param());
    }
    if (cached_has_bits & 0x00200000u) {
      mutable_memory_data_param()->::caffe::MemoryDataParameter::MergeFrom(from.memory_data_param());
    }
    if (cached_has_bits & 0x00400000u) {
      mutable_mvn_param()->::caffe::MVNParameter::MergeFrom(from.mvn_param());
    }
    if (cached_has_bits & 0x00800000u) {
      mutable_pooling_param()->::caffe::PoolingParameter::MergeFrom(from.pooling_param());
    }
  }
  if (cached_has_bits & 4278190080u) {
    if (cached_has_bits & 0x01000000u) {
      mutable_power_param()->::caffe::PowerParameter::MergeFrom(from.power_param());
    }
    if (cached_has_bits & 0x02000000u) {
      mutable_relu_param()->::caffe::ReLUParameter::MergeFrom(from.relu_param());
    }
    if (cached_has_bits & 0x04000000u) {
      mutable_sigmoid_param()->::caffe::SigmoidParameter::MergeFrom(from.sigmoid_param());
    }
    if (cached_has_bits & 0x08000000u) {
      mutable_softmax_param()->::caffe::SoftmaxParameter::MergeFrom(from.softmax_param());
    }
    if (cached_has_bits & 0x10000000u) {
      mutable_slice_param()->::caffe::SliceParameter::MergeFrom(from.slice_param());
    }
    if (cached_has_bits & 0x20000000u) {
      mutable_tanh_param()->::caffe::TanHParameter::MergeFrom(from.tanh_param());
    }
    if (cached_has_bits & 0x40000000u) {
      mutable_threshold_param()->::caffe::ThresholdParameter::MergeFrom(from.threshold_param());
    }
    if (cached_has_bits & 0x80000000u) {
      mutable_window_data_param()->::caffe::WindowDataParameter::MergeFrom(from.window_data_param());
    }
  }
  cached_has_bits = from._has_bits_[1];
  if (cached_has_bits & 255u) {
    if (cached_has_bits & 0x00000001u) {
      mutable_python_param()->::caffe::PythonParameter::MergeFrom(from.python_param());
    }
    if (cached_has_bits & 0x00000002u) {
      mutable_prelu_param()->::caffe::PReLUParameter::MergeFrom(from.prelu_param());
    }
    if (cached_has_bits & 0x00000004u) {
      mutable_spp_param()->::caffe::SPPParameter::MergeFrom(from.spp_param());
    }
    if (cached_has_bits & 0x00000008u) {
      mutable_reshape_param()->::caffe::ReshapeParameter::MergeFrom(from.reshape_param());
    }
    if (cached_has_bits & 0x00000010u) {
      mutable_log_param()->::caffe::LogParameter::MergeFrom(from.log_param());
    }
    if (cached_has_bits & 0x00000020u) {
      mutable_flatten_param()->::caffe::FlattenParameter::MergeFrom(from.flatten_param());
    }
    if (cached_has_bits & 0x00000040u) {
      mutable_reduction_param()->::caffe::ReductionParameter::MergeFrom(from.reduction_param());
    }
    if (cached_has_bits & 0x00000080u) {
      mutable_embed_param()->::caffe::EmbedParameter::MergeFrom(from.embed_param());
    }
  }
  if (cached_has_bits & 65280u) {
    if (cached_has_bits & 0x00000100u) {
      mutable_tile_param()->::caffe::TileParameter::MergeFrom(from.tile_param());
    }
    if (cached_has_bits & 0x00000200u) {
      mutable_batch_norm_param()->::caffe::BatchNormParameter::MergeFrom(from.batch_norm_param());
    }
    if (cached_has_bits & 0x00000400u) {
      mutable_elu_param()->::caffe::ELUParameter::MergeFrom(from.elu_param());
    }
    if (cached_has_bits & 0x00000800u) {
      mutable_bias_param()->::caffe::BiasParameter::MergeFrom(from.bias_param());
    }
    if (cached_has_bits & 0x00001000u) {
      mutable_scale_param()->::caffe::ScaleParameter::MergeFrom(from.scale_param());
    }
    if (cached_has_bits & 0x00002000u) {
      mutable_input_param()->::caffe::InputParameter::MergeFrom(from.input_param());
    }
    if (cached_has_bits & 0x00004000u) {
      mutable_crop_param()->::caffe::CropParameter::MergeFrom(from.crop_param());
    }
    if (cached_has_bits & 0x00008000u) {
      mutable_parameter_param()->::caffe::ParameterParameter::MergeFrom(from.parameter_param());
    }
  }
  if (cached_has_bits & 196608u) {
    if (cached_has_bits & 0x00010000u) {
      mutable_recurrent_param()->::caffe::RecurrentParameter::MergeFrom(from.recurrent_param());
    }
    if (cached_has_bits & 0x00020000u) {
      phase_ = from.phase_;
    }
    _has_bits_[1] |= cached_has_bits;
  }
}